

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManResubPerform_rec(Gia_ResbMan_t *p,int nLimit)

{
  Vec_Int_t **vUnateLits;
  Vec_Int_t **vUnateLitsW;
  Vec_Int_t **vUnatePairs;
  Vec_Int_t **vUnateLitsW_00;
  word **pSets;
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *p_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  word *pIn2;
  int iVar17;
  int iVar18;
  int iVar19;
  
  iVar19 = p->vDivs->nSize;
  if (p->fVerbose != 0) {
    iVar6 = p->nWords;
    uVar2 = Abc_TtCountOnesVec(p->pSets[0],iVar6);
    uVar3 = Abc_TtCountOnesVec(p->pSets[1],iVar6);
    printf("      ");
    printf("ISF: ");
    printf("0=%5d (%5.2f %%) ",((double)(int)uVar2 * 100.0) / (double)(p->nWords << 6),(ulong)uVar2)
    ;
    printf("1=%5d (%5.2f %%)  ",((double)(int)uVar3 * 100.0) / (double)(p->nWords << 6),(ulong)uVar3
          );
  }
  iVar6 = p->nWords;
  iVar4 = Abc_TtIsConst0(p->pSets[1],iVar6);
  iVar5 = 0;
  if (iVar4 == 0) {
    pSets = p->pSets;
    iVar5 = Abc_TtIsConst0(*pSets,iVar6);
    if (iVar5 == 0) {
      vUnateLits = p->vUnateLits;
      iVar5 = Gia_ManFindOneUnate(pSets,p->vDivs,iVar6,vUnateLits,p->vNotUnateVars,p->fVerbose);
      if (iVar5 < 0) {
        iVar5 = -1;
        if (nLimit != 0) {
          vUnateLitsW = p->vUnateLitsW;
          Gia_ManSortUnates(pSets,p->vDivs,p->nWords,vUnateLits,vUnateLitsW,p->vSorter);
          iVar6 = Gia_ManFindTwoUnate(pSets,p->vDivs,p->nWords,vUnateLits,vUnateLitsW,p->fVerbose);
          if (-1 < iVar6) {
            iVar5 = p->vGates->nSize;
            uVar3 = Abc_LitIsCompl(iVar6);
            uVar2 = Abc_Lit2Var(iVar6);
            uVar7 = Abc_Lit2Var(iVar6);
            if (uVar7 >> 0xf <= (uVar2 & 0x7fff)) {
              __assert_fail("iDiv0 < iDiv1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                            ,0x456,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
            }
            iVar19 = iVar19 + iVar5 / 2;
            Vec_IntPushTwo(p->vGates,uVar2 & 0x7fff,uVar7 >> 0xf);
LAB_00616a66:
            iVar19 = Abc_Var2Lit(iVar19,uVar3);
            return iVar19;
          }
          Vec_IntTwoFindCommon(p->vNotUnateVars[0],p->vNotUnateVars[1],p->vBinateVars);
          if (p->nDivsMax < p->vBinateVars->nSize) {
            Vec_IntShrink(p->vBinateVars,p->nDivsMax);
          }
          if (p->fVerbose != 0) {
            printf("  B = %3d",(ulong)(uint)p->vBinateVars->nSize);
          }
          if (p->fUseXor != 0) {
            iVar6 = Gia_ManFindXor(pSets,p->vDivs,p->nWords,p->vBinateVars,p->vUnatePairs,
                                   p->fVerbose);
            if (-1 < iVar6) {
              iVar5 = p->vGates->nSize;
              uVar3 = Abc_LitIsCompl(iVar6);
              uVar2 = Abc_Lit2Var(iVar6);
              uVar2 = uVar2 & 0x7fff;
              uVar7 = Abc_Lit2Var(iVar6);
              iVar6 = Abc_LitIsCompl(uVar2);
              if (iVar6 != 0) {
                __assert_fail("!Abc_LitIsCompl(iDiv0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x468,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              uVar7 = uVar7 >> 0xf;
              iVar6 = Abc_LitIsCompl(uVar7);
              if (iVar6 != 0) {
                __assert_fail("!Abc_LitIsCompl(iDiv1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x469,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              if (uVar2 <= uVar7) {
                __assert_fail("iDiv0 > iDiv1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                              ,0x46a,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
              }
              iVar19 = iVar5 / 2 + iVar19;
              Vec_IntPushTwo(p->vGates,uVar2,uVar7);
              goto LAB_00616a66;
            }
          }
          if (nLimit != 1) {
            vUnatePairs = p->vUnatePairs;
            Gia_ManFindUnatePairs(pSets,p->vDivs,p->nWords,p->vBinateVars,vUnatePairs,p->fVerbose);
            vUnateLitsW_00 = p->vUnatePairsW;
            Gia_ManSortPairs(pSets,p->vDivs,p->nWords,vUnatePairs,vUnateLitsW_00,p->vSorter);
            iVar6 = Gia_ManFindDivGate(pSets,p->vDivs,p->nWords,vUnateLits,vUnatePairs,vUnateLitsW,
                                       vUnateLitsW_00,p->pDivA);
            if (-1 < iVar6) {
              iVar5 = p->vGates->nSize / 2;
              uVar3 = Abc_LitIsCompl(iVar6);
              uVar2 = Abc_Lit2Var(iVar6);
              uVar7 = Abc_Lit2Var(iVar6);
              pVVar1 = p->vUnatePairs[uVar3 ^ 1];
              iVar6 = Abc_Lit2Var(uVar7 >> 0xf);
              iVar6 = Vec_IntEntry(pVVar1,iVar6);
              uVar8 = Abc_LitIsCompl(iVar6);
              uVar7 = Abc_LitIsCompl(uVar7 >> 0xf);
              uVar9 = Abc_Lit2Var(iVar6);
              uVar10 = Abc_Lit2Var(iVar6);
              Vec_IntPushTwo(p->vGates,uVar9 & 0x7fff,uVar10 >> 0xf);
              pVVar1 = p->vGates;
              iVar6 = Abc_Var2Lit(iVar5 + iVar19,uVar8 ^ uVar7);
              Vec_IntPushTwo(pVVar1,uVar2 & 0x7fff,iVar6);
              iVar19 = iVar5 + iVar19 + 1;
              goto LAB_00616a66;
            }
            if (nLimit != 2) {
              iVar6 = Gia_ManFindGateGate(pSets,p->vDivs,p->nWords,vUnatePairs,vUnateLitsW_00,
                                          p->pDivA,p->pDivB);
              if (-1 < iVar6) {
                iVar5 = p->vGates->nSize / 2;
                uVar3 = Abc_LitIsCompl(iVar6);
                uVar2 = Abc_Lit2Var(iVar6);
                uVar7 = Abc_Lit2Var(iVar6);
                pVVar1 = p->vUnatePairs[uVar3 ^ 1];
                iVar6 = Abc_Lit2Var(uVar2 & 0x7fff);
                iVar6 = Vec_IntEntry(pVVar1,iVar6);
                uVar8 = Abc_LitIsCompl(iVar6);
                uVar2 = Abc_LitIsCompl(uVar2 & 0x7fff);
                uVar9 = Abc_Lit2Var(iVar6);
                uVar10 = Abc_Lit2Var(iVar6);
                pVVar1 = p->vUnatePairs[uVar3 ^ 1];
                iVar6 = Abc_Lit2Var(uVar7 >> 0xf);
                iVar6 = Vec_IntEntry(pVVar1,iVar6);
                uVar11 = Abc_LitIsCompl(iVar6);
                uVar7 = Abc_LitIsCompl(uVar7 >> 0xf);
                uVar12 = Abc_Lit2Var(iVar6);
                uVar13 = Abc_Lit2Var(iVar6);
                Vec_IntPushTwo(p->vGates,uVar9 & 0x7fff,uVar10 >> 0xf);
                Vec_IntPushTwo(p->vGates,uVar12 & 0x7fff,uVar13 >> 0xf);
                pVVar1 = p->vGates;
                iVar6 = Abc_Var2Lit(iVar5 + iVar19,uVar8 ^ uVar2);
                iVar4 = Abc_Var2Lit(iVar5 + iVar19 + 1,uVar11 ^ uVar7);
                Vec_IntPushTwo(pVVar1,iVar6,iVar4);
                iVar19 = iVar5 + iVar19 + 2;
                goto LAB_00616a66;
              }
              if ((nLimit != 3) &&
                 (p->vUnateLits[1]->nSize + p->vUnateLits[0]->nSize + p->vUnatePairs[0]->nSize +
                  p->vUnatePairs[1]->nSize != 0)) {
                iVar4 = 0;
                iVar6 = 0;
                if ((*vUnateLitsW)->nSize != 0) {
                  iVar6 = Vec_IntEntry(*vUnateLitsW,0);
                }
                if (p->vUnateLitsW[1]->nSize != 0) {
                  iVar4 = Vec_IntEntry(p->vUnateLitsW[1],0);
                }
                iVar15 = 0;
                iVar14 = 0;
                if ((*vUnateLitsW_00)->nSize != 0) {
                  iVar14 = Vec_IntEntry(*vUnateLitsW_00,0);
                }
                if (p->vUnatePairsW[1]->nSize != 0) {
                  iVar15 = Vec_IntEntry(p->vUnatePairsW[1],0);
                }
                iVar17 = iVar4;
                if (iVar4 < iVar6) {
                  iVar17 = iVar6;
                }
                iVar16 = iVar15;
                if (iVar15 < iVar14) {
                  iVar16 = iVar14;
                }
                iVar18 = iVar16;
                if (iVar16 < iVar17) {
                  iVar18 = iVar17;
                }
                if (iVar18 != 0) {
                  if (iVar16 / 2 < iVar17) {
                    iVar14 = Vec_IntEntry(p->vUnateLits[iVar6 < iVar4],0);
                    uVar2 = Abc_LitIsCompl(iVar14);
                    p_00 = p->vDivs;
                    iVar15 = Abc_Lit2Var(iVar14);
                    pIn2 = (word *)Vec_PtrEntry(p_00,iVar15);
                    Abc_TtAndSharp(p->pSets[iVar4 <= iVar6],p->pSets[iVar4 <= iVar6],pIn2,p->nWords,
                                   uVar2 ^ 1);
                    if (p->fVerbose != 0) {
                      putchar(10);
                    }
                    iVar15 = Gia_ManResubPerform_rec(p,nLimit + -1);
                    if (-1 < iVar15) {
                      pVVar1 = p->vGates;
                      iVar19 = iVar19 + pVVar1->nSize / 2;
                      iVar5 = Abc_LitNot(iVar14);
                      uVar3 = (uint)(iVar4 <= iVar6);
                      iVar6 = Abc_LitNotCond(iVar15,uVar3);
                      Vec_IntPushTwo(pVVar1,iVar5,iVar6);
                      goto LAB_00616a66;
                    }
                  }
                  else {
                    iVar6 = Vec_IntEntry(p->vUnatePairs[iVar14 < iVar15],0);
                    uVar2 = Abc_LitIsCompl(iVar6);
                    Gia_ManDeriveDivPair(iVar6,p->vDivs,p->nWords,p->pDivA);
                    Abc_TtAndSharp(p->pSets[iVar15 <= iVar14],p->pSets[iVar15 <= iVar14],p->pDivA,
                                   p->nWords,uVar2 ^ 1);
                    if (p->fVerbose != 0) {
                      putchar(10);
                    }
                    iVar4 = Gia_ManResubPerform_rec(p,nLimit + -2);
                    if (-1 < iVar4) {
                      iVar5 = p->vGates->nSize / 2;
                      uVar3 = Abc_Lit2Var(iVar6);
                      uVar7 = Abc_Lit2Var(iVar6);
                      Vec_IntPushTwo(p->vGates,uVar3 & 0x7fff,uVar7 >> 0xf);
                      pVVar1 = p->vGates;
                      uVar3 = (uint)(iVar15 <= iVar14);
                      iVar6 = Abc_LitNotCond(iVar4,uVar3);
                      iVar4 = Abc_Var2Lit(iVar5 + iVar19,uVar2 ^ 1);
                      Vec_IntPushTwo(pVVar1,iVar6,iVar4);
                      iVar19 = iVar5 + iVar19 + 1;
                      goto LAB_00616a66;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int Gia_ManResubPerform_rec( Gia_ResbMan_t * p, int nLimit )
{
    int TopOneW[2] = {0}, TopTwoW[2] = {0}, Max1, Max2, iResLit, nVars = Vec_PtrSize(p->vDivs);
    if ( p->fVerbose )
    {
        int nMints[2] = { Abc_TtCountOnesVec(p->pSets[0], p->nWords), Abc_TtCountOnesVec(p->pSets[1], p->nWords) };
        printf( "      " ); 
        printf( "ISF: " ); 
        printf( "0=%5d (%5.2f %%) ",  nMints[0], 100.0*nMints[0]/(64*p->nWords) );
        printf( "1=%5d (%5.2f %%)  ", nMints[1], 100.0*nMints[1]/(64*p->nWords) );
    }
    if ( Abc_TtIsConst0( p->pSets[1], p->nWords ) )
        return 0;
    if ( Abc_TtIsConst0( p->pSets[0], p->nWords ) )
        return 1;
    iResLit = Gia_ManFindOneUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vNotUnateVars, p->fVerbose );
    if ( iResLit >= 0 ) // buffer
        return iResLit;
    if ( nLimit == 0 )
        return -1;
    Gia_ManSortUnates( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->vSorter );
    iResLit = Gia_ManFindTwoUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->fVerbose );
    if ( iResLit >= 0 ) // and
    {
        int iNode = nVars + Vec_IntSize(p->vGates)/2;
        int fComp = Abc_LitIsCompl(iResLit);
        int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
        int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
        assert( iDiv0 < iDiv1 );
        Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
        return Abc_Var2Lit( iNode, fComp );
    }
    Vec_IntTwoFindCommon( p->vNotUnateVars[0], p->vNotUnateVars[1], p->vBinateVars );
    if ( Vec_IntSize(p->vBinateVars) > p->nDivsMax )
        Vec_IntShrink( p->vBinateVars, p->nDivsMax );
    if ( p->fVerbose ) printf( "  B = %3d", Vec_IntSize(p->vBinateVars) );
    //Gia_ManSortBinate( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vSorter );
    if ( p->fUseXor )
    {
        iResLit = Gia_ManFindXor( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
        if ( iResLit >= 0 ) // xor
        {
            int iNode = nVars + Vec_IntSize(p->vGates)/2;
            int fComp = Abc_LitIsCompl(iResLit);
            int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
            int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
            assert( !Abc_LitIsCompl(iDiv0) );
            assert( !Abc_LitIsCompl(iDiv1) );
            assert( iDiv0 > iDiv1 );
            Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
            return Abc_Var2Lit( iNode, fComp );
        }
    }
    if ( nLimit == 1 )
        return -1;
    Gia_ManFindUnatePairs( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
    Gia_ManSortPairs( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->vSorter );
    iResLit = Gia_ManFindDivGate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnatePairs, p->vUnateLitsW, p->vUnatePairsW, p->pDivA );
    if ( iResLit >= 0 ) // and(div,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // div
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   

        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, iDiv0, Abc_Var2Lit(iNode, fComp1) );
        return Abc_Var2Lit( iNode+1, fComp );
    }
    if ( nLimit == 2 )
        return -1;
    iResLit = Gia_ManFindGateGate( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->pDivA, p->pDivB );
    if ( iResLit >= 0 ) // and(pair,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // pair
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div0   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv0) );
        int fComp0 = Abc_LitIsCompl(Div0) ^ Abc_LitIsCompl(iDiv0);
        int iDiv00 = Abc_Lit2Var(Div0) & 0x7FFF;
        int iDiv01 = Abc_Lit2Var(Div0) >> 15;   
        
        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   
        
        Vec_IntPushTwo( p->vGates, iDiv00, iDiv01 );
        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, Abc_Var2Lit(iNode, fComp0), Abc_Var2Lit(iNode+1, fComp1) );
        return Abc_Var2Lit( iNode+2, fComp );
    }
    if ( nLimit == 3 )
        return -1;
    if ( Vec_IntSize(p->vUnateLits[0]) + Vec_IntSize(p->vUnateLits[1]) + Vec_IntSize(p->vUnatePairs[0]) + Vec_IntSize(p->vUnatePairs[1]) == 0 )
        return -1;

    TopOneW[0] = Vec_IntSize(p->vUnateLitsW[0]) ? Vec_IntEntry(p->vUnateLitsW[0], 0) : 0;
    TopOneW[1] = Vec_IntSize(p->vUnateLitsW[1]) ? Vec_IntEntry(p->vUnateLitsW[1], 0) : 0;

    TopTwoW[0] = Vec_IntSize(p->vUnatePairsW[0]) ? Vec_IntEntry(p->vUnatePairsW[0], 0) : 0;
    TopTwoW[1] = Vec_IntSize(p->vUnatePairsW[1]) ? Vec_IntEntry(p->vUnatePairsW[1], 0) : 0;

    Max1 = Abc_MaxInt(TopOneW[0], TopOneW[1]);
    Max2 = Abc_MaxInt(TopTwoW[0], TopTwoW[1]);
    if ( Abc_MaxInt(Max1, Max2) == 0 )
        return -1;
    if ( Max1 > Max2/2 )
    {
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
        if ( Max2 == 0 )
            return -1;
/*
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
*/
    }
    else
    {
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
        if ( Max1 == 0 )
            return -1;
/*
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
*/
    }
    return -1;
}